

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::addStorage
          (Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  byte bVar4;
  undefined8 uVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  Entry *pEVar16;
  Entry *pEVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [16];
  int iVar47;
  undefined1 auVar45 [16];
  int iVar48;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar72;
  undefined1 auVar71 [16];
  int iVar73;
  long lVar74;
  long lVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long lVar83;
  long lVar84;
  
  bVar4 = this->allocated;
  if (bVar4 == 0) {
    lVar15 = 0x30;
  }
  else if (bVar4 == 0x30) {
    lVar15 = 0x50;
  }
  else {
    lVar15 = (ulong)bVar4 + 0x10;
  }
  pEVar16 = (Entry *)operator_new__(lVar15 * 0x38);
  uVar21 = (ulong)this->allocated;
  if (uVar21 != 0) {
    lVar19 = 0;
    uVar20 = 0;
    do {
      puVar1 = (pEVar16->storage).data + lVar19;
      pEVar17 = this->entries;
      puVar2 = (pEVar17->storage).data + lVar19;
      uVar5 = *(undefined8 *)(puVar2 + 8);
      puVar3 = (pEVar16->storage).data + lVar19;
      *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
      *(undefined8 *)(puVar3 + 8) = uVar5;
      uVar5 = *(undefined8 *)((pEVar17->storage).data + lVar19 + 0x10);
      puVar2 = (pEVar17->storage).data + lVar19 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((pEVar16->storage).data + lVar19 + 0x10) = uVar5;
      uVar5 = *(undefined8 *)((pEVar17->storage).data + lVar19 + 0x18);
      puVar2 = (pEVar17->storage).data + lVar19 + 0x18;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((pEVar16->storage).data + lVar19 + 0x18) = uVar5;
      uVar5 = *(undefined8 *)((pEVar17->storage).data + lVar19 + 0x20);
      puVar2 = (pEVar17->storage).data + lVar19 + 0x20;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((pEVar16->storage).data + lVar19 + 0x20) = uVar5;
      *(undefined8 *)((pEVar16->storage).data + lVar19 + 0x28) =
           *(undefined8 *)((pEVar17->storage).data + lVar19 + 0x28);
      *(undefined8 *)((pEVar16->storage).data + lVar19 + 0x30) =
           *(undefined8 *)((pEVar17->storage).data + lVar19 + 0x30);
      puVar2 = (pEVar17->storage).data + lVar19 + 0x28;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(uchar **)(*(long *)((pEVar16->storage).data + lVar19) + 8) = puVar1;
      **(long **)((pEVar16->storage).data + lVar19 + 8) = (long)puVar1;
      pEVar17 = this->entries;
      QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Value::~Value
                ((Value *)((pEVar17->storage).data + lVar19 + 0x28));
      piVar6 = *(int **)((pEVar17->storage).data + lVar19 + 0x10);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          QArrayData::deallocate(*(QArrayData **)((pEVar17->storage).data + lVar19 + 0x10),1,0x10);
        }
      }
      uVar20 = uVar20 + 1;
      uVar21 = (ulong)this->allocated;
      lVar19 = lVar19 + 0x38;
    } while (uVar20 < uVar21);
  }
  if ((uint)uVar21 < (uint)lVar15) {
    lVar19 = lVar15 - uVar21;
    lVar18 = lVar19 + -1;
    lVar74 = uVar21 + 0xe;
    lVar82 = uVar21 + 0xf;
    lVar32 = uVar21 + 0xc;
    lVar33 = uVar21 + 0xd;
    lVar34 = uVar21 + 10;
    lVar35 = uVar21 + 0xb;
    lVar36 = uVar21 + 8;
    lVar37 = uVar21 + 9;
    lVar38 = uVar21 + 6;
    lVar39 = uVar21 + 7;
    lVar40 = uVar21 + 4;
    lVar41 = uVar21 + 5;
    lVar83 = uVar21 + 2;
    lVar84 = uVar21 + 3;
    lVar22 = uVar21 + 1;
    auVar23._8_4_ = (int)lVar18;
    auVar23._0_8_ = lVar18;
    auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
    pEVar17 = pEVar16 + uVar21;
    uVar20 = 0;
    do {
      auVar71._8_4_ = (int)uVar20;
      auVar71._0_8_ = uVar20;
      auVar71._12_4_ = (int)(uVar20 >> 0x20);
      auVar44 = auVar23 ^ _DAT_00684850;
      auVar42 = (auVar71 | _DAT_00684840) ^ _DAT_00684850;
      iVar72 = auVar44._0_4_;
      iVar48 = -(uint)(iVar72 < auVar42._0_4_);
      iVar73 = auVar44._4_4_;
      iVar59 = -(uint)(iVar73 < auVar42._4_4_);
      iVar46 = auVar44._8_4_;
      iVar60 = -(uint)(iVar46 < auVar42._8_4_);
      iVar47 = auVar44._12_4_;
      iVar61 = -(uint)(iVar47 < auVar42._12_4_);
      auVar75._4_4_ = iVar48;
      auVar75._0_4_ = iVar48;
      auVar75._8_4_ = iVar60;
      auVar75._12_4_ = iVar60;
      auVar67 = pshuflw(in_XMM12,auVar75,0xe8);
      auVar49._4_4_ = -(uint)(auVar42._4_4_ == iVar73);
      auVar49._12_4_ = -(uint)(auVar42._12_4_ == iVar47);
      auVar49._0_4_ = auVar49._4_4_;
      auVar49._8_4_ = auVar49._12_4_;
      auVar62 = pshuflw(in_XMM10,auVar49,0xe8);
      auVar43._4_4_ = iVar59;
      auVar43._0_4_ = iVar59;
      auVar43._8_4_ = iVar61;
      auVar43._12_4_ = iVar61;
      auVar44 = pshuflw(_DAT_00684850,auVar43,0xe8);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar44 | auVar62 & auVar67) ^ auVar42;
      auVar42 = packssdw(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (pEVar17->storage).data[0] = (char)uVar21 + '\x01';
      }
      auVar43 = auVar49 & auVar75 | auVar43;
      auVar42 = packssdw(auVar43,auVar43);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar44,auVar42 ^ auVar44);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 8 & 1) != 0) {
        pEVar17[1].storage.data[0] = (char)lVar22 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_00684830) ^ _DAT_00684850;
      iVar48 = -(uint)(iVar72 < auVar42._0_4_);
      iVar60 = -(uint)(iVar73 < auVar42._4_4_);
      iVar59 = -(uint)(iVar46 < auVar42._8_4_);
      iVar61 = -(uint)(iVar47 < auVar42._12_4_);
      auVar67._4_4_ = iVar48;
      auVar67._0_4_ = iVar48;
      auVar67._8_4_ = iVar59;
      auVar67._12_4_ = iVar59;
      iVar48 = -(uint)(auVar42._4_4_ == iVar73);
      iVar59 = -(uint)(auVar42._12_4_ == iVar47);
      auVar76._4_4_ = iVar48;
      auVar76._0_4_ = iVar48;
      auVar76._8_4_ = iVar59;
      auVar76._12_4_ = iVar59;
      auVar68._4_4_ = iVar60;
      auVar68._0_4_ = iVar60;
      auVar68._8_4_ = iVar61;
      auVar68._12_4_ = iVar61;
      auVar42 = auVar76 & auVar67 | auVar68;
      auVar42 = packssdw(auVar42,auVar42);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar62,auVar42 ^ auVar62);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
        pEVar17[2].storage.data[0] = (char)lVar83 + '\x01';
      }
      auVar42 = pshufhw(auVar42,auVar67,0x84);
      auVar49 = pshufhw(auVar67,auVar76,0x84);
      auVar44 = pshufhw(auVar42,auVar68,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar24 = (auVar44 | auVar49 & auVar42) ^ auVar24;
      auVar42 = packssdw(auVar24,auVar24);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
        pEVar17[3].storage.data[0] = (char)lVar84 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_00684820) ^ _DAT_00684850;
      auVar63._0_4_ = -(uint)(iVar72 < auVar42._0_4_);
      auVar63._4_4_ = -(uint)(iVar73 < auVar42._4_4_);
      auVar63._8_4_ = -(uint)(iVar46 < auVar42._8_4_);
      auVar63._12_4_ = -(uint)(iVar47 < auVar42._12_4_);
      auVar77._4_4_ = auVar63._0_4_;
      auVar77._0_4_ = auVar63._0_4_;
      auVar77._8_4_ = auVar63._8_4_;
      auVar77._12_4_ = auVar63._8_4_;
      auVar49 = pshuflw(auVar68,auVar77,0xe8);
      auVar25._0_4_ = -(uint)(auVar42._0_4_ == iVar72);
      auVar25._4_4_ = -(uint)(auVar42._4_4_ == iVar73);
      auVar25._8_4_ = -(uint)(auVar42._8_4_ == iVar46);
      auVar25._12_4_ = -(uint)(auVar42._12_4_ == iVar47);
      auVar50._4_4_ = auVar25._4_4_;
      auVar50._0_4_ = auVar25._4_4_;
      auVar50._8_4_ = auVar25._12_4_;
      auVar50._12_4_ = auVar25._12_4_;
      auVar42 = pshuflw(auVar25,auVar50,0xe8);
      auVar51._4_4_ = auVar63._4_4_;
      auVar51._0_4_ = auVar63._4_4_;
      auVar51._8_4_ = auVar63._12_4_;
      auVar51._12_4_ = auVar63._12_4_;
      auVar44 = pshuflw(auVar63,auVar51,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 & auVar49,(auVar44 | auVar42 & auVar49) ^ auVar7);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar17[4].storage.data[0] = (char)lVar40 + '\x01';
      }
      auVar51 = auVar50 & auVar77 | auVar51;
      auVar44 = packssdw(auVar51,auVar51);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar44 ^ auVar8);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._4_2_ >> 8 & 1) != 0) {
        pEVar17[5].storage.data[0] = (char)lVar41 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_00684810) ^ _DAT_00684850;
      iVar48 = -(uint)(iVar72 < auVar42._0_4_);
      iVar60 = -(uint)(iVar73 < auVar42._4_4_);
      iVar59 = -(uint)(iVar46 < auVar42._8_4_);
      iVar61 = -(uint)(iVar47 < auVar42._12_4_);
      auVar52._4_4_ = iVar48;
      auVar52._0_4_ = iVar48;
      auVar52._8_4_ = iVar59;
      auVar52._12_4_ = iVar59;
      iVar48 = -(uint)(auVar42._4_4_ == iVar73);
      iVar59 = -(uint)(auVar42._12_4_ == iVar47);
      auVar69._4_4_ = iVar48;
      auVar69._0_4_ = iVar48;
      auVar69._8_4_ = iVar59;
      auVar69._12_4_ = iVar59;
      auVar78._4_4_ = iVar60;
      auVar78._0_4_ = iVar60;
      auVar78._8_4_ = iVar61;
      auVar78._12_4_ = iVar61;
      auVar42 = auVar69 & auVar52 | auVar78;
      auVar42 = packssdw(auVar42,auVar42);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar9,auVar42 ^ auVar9);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar17[6].storage.data[0] = (char)lVar38 + '\x01';
      }
      auVar42 = pshufhw(auVar42,auVar52,0x84);
      auVar49 = pshufhw(auVar52,auVar69,0x84);
      auVar44 = pshufhw(auVar42,auVar78,0x84);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar44 | auVar49 & auVar42) ^ auVar26;
      auVar42 = packssdw(auVar26,auVar26);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._6_2_ >> 8 & 1) != 0) {
        pEVar17[7].storage.data[0] = (char)lVar39 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_00684800) ^ _DAT_00684850;
      auVar64._0_4_ = -(uint)(iVar72 < auVar42._0_4_);
      auVar64._4_4_ = -(uint)(iVar73 < auVar42._4_4_);
      auVar64._8_4_ = -(uint)(iVar46 < auVar42._8_4_);
      auVar64._12_4_ = -(uint)(iVar47 < auVar42._12_4_);
      auVar79._4_4_ = auVar64._0_4_;
      auVar79._0_4_ = auVar64._0_4_;
      auVar79._8_4_ = auVar64._8_4_;
      auVar79._12_4_ = auVar64._8_4_;
      auVar49 = pshuflw(auVar69,auVar79,0xe8);
      auVar27._0_4_ = -(uint)(auVar42._0_4_ == iVar72);
      auVar27._4_4_ = -(uint)(auVar42._4_4_ == iVar73);
      auVar27._8_4_ = -(uint)(auVar42._8_4_ == iVar46);
      auVar27._12_4_ = -(uint)(auVar42._12_4_ == iVar47);
      auVar53._4_4_ = auVar27._4_4_;
      auVar53._0_4_ = auVar27._4_4_;
      auVar53._8_4_ = auVar27._12_4_;
      auVar53._12_4_ = auVar27._12_4_;
      auVar42 = pshuflw(auVar27,auVar53,0xe8);
      auVar54._4_4_ = auVar64._4_4_;
      auVar54._0_4_ = auVar64._4_4_;
      auVar54._8_4_ = auVar64._12_4_;
      auVar54._12_4_ = auVar64._12_4_;
      auVar44 = pshuflw(auVar64,auVar54,0xe8);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar44 | auVar42 & auVar49) ^ auVar65;
      auVar44 = packssdw(auVar65,auVar65);
      auVar42 = packsswb(auVar42 & auVar49,auVar44);
      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar17[8].storage.data[0] = (char)lVar36 + '\x01';
      }
      auVar54 = auVar53 & auVar79 | auVar54;
      auVar44 = packssdw(auVar54,auVar54);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar10,auVar44 ^ auVar10);
      auVar42 = packsswb(auVar42,auVar44);
      if ((auVar42._8_2_ >> 8 & 1) != 0) {
        pEVar17[9].storage.data[0] = (char)lVar37 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_006847f0) ^ _DAT_00684850;
      iVar48 = -(uint)(iVar72 < auVar42._0_4_);
      iVar60 = -(uint)(iVar73 < auVar42._4_4_);
      iVar59 = -(uint)(iVar46 < auVar42._8_4_);
      iVar61 = -(uint)(iVar47 < auVar42._12_4_);
      auVar55._4_4_ = iVar48;
      auVar55._0_4_ = iVar48;
      auVar55._8_4_ = iVar59;
      auVar55._12_4_ = iVar59;
      iVar48 = -(uint)(auVar42._4_4_ == iVar73);
      iVar59 = -(uint)(auVar42._12_4_ == iVar47);
      auVar70._4_4_ = iVar48;
      auVar70._0_4_ = iVar48;
      auVar70._8_4_ = iVar59;
      auVar70._12_4_ = iVar59;
      auVar80._4_4_ = iVar60;
      auVar80._0_4_ = iVar60;
      auVar80._8_4_ = iVar61;
      auVar80._12_4_ = iVar61;
      auVar42 = auVar70 & auVar55 | auVar80;
      auVar42 = packssdw(auVar42,auVar42);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar11,auVar42 ^ auVar11);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pEVar17[10].storage.data[0] = (char)lVar34 + '\x01';
      }
      auVar42 = pshufhw(auVar42,auVar55,0x84);
      auVar49 = pshufhw(auVar55,auVar70,0x84);
      auVar44 = pshufhw(auVar42,auVar80,0x84);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar28 = (auVar44 | auVar49 & auVar42) ^ auVar28;
      auVar42 = packssdw(auVar28,auVar28);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._10_2_ >> 8 & 1) != 0) {
        pEVar17[0xb].storage.data[0] = (char)lVar35 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_006847e0) ^ _DAT_00684850;
      auVar66._0_4_ = -(uint)(iVar72 < auVar42._0_4_);
      auVar66._4_4_ = -(uint)(iVar73 < auVar42._4_4_);
      auVar66._8_4_ = -(uint)(iVar46 < auVar42._8_4_);
      auVar66._12_4_ = -(uint)(iVar47 < auVar42._12_4_);
      auVar81._4_4_ = auVar66._0_4_;
      auVar81._0_4_ = auVar66._0_4_;
      auVar81._8_4_ = auVar66._8_4_;
      auVar81._12_4_ = auVar66._8_4_;
      auVar49 = pshuflw(auVar70,auVar81,0xe8);
      auVar29._0_4_ = -(uint)(auVar42._0_4_ == iVar72);
      auVar29._4_4_ = -(uint)(auVar42._4_4_ == iVar73);
      auVar29._8_4_ = -(uint)(auVar42._8_4_ == iVar46);
      auVar29._12_4_ = -(uint)(auVar42._12_4_ == iVar47);
      auVar56._4_4_ = auVar29._4_4_;
      auVar56._0_4_ = auVar29._4_4_;
      auVar56._8_4_ = auVar29._12_4_;
      auVar56._12_4_ = auVar29._12_4_;
      auVar42 = pshuflw(auVar29,auVar56,0xe8);
      auVar57._4_4_ = auVar66._4_4_;
      auVar57._0_4_ = auVar66._4_4_;
      auVar57._8_4_ = auVar66._12_4_;
      auVar57._12_4_ = auVar66._12_4_;
      auVar44 = pshuflw(auVar66,auVar57,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 & auVar49,(auVar44 | auVar42 & auVar49) ^ auVar12);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar17[0xc].storage.data[0] = (char)lVar32 + '\x01';
      }
      auVar57 = auVar56 & auVar81 | auVar57;
      auVar44 = packssdw(auVar57,auVar57);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42,auVar44 ^ auVar13);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._12_2_ >> 8 & 1) != 0) {
        pEVar17[0xd].storage.data[0] = (char)lVar33 + '\x01';
      }
      auVar42 = (auVar71 | _DAT_006847d0) ^ _DAT_00684850;
      auVar30._0_4_ = -(uint)(iVar72 < auVar42._0_4_);
      auVar30._4_4_ = -(uint)(iVar73 < auVar42._4_4_);
      auVar30._8_4_ = -(uint)(iVar46 < auVar42._8_4_);
      auVar30._12_4_ = -(uint)(iVar47 < auVar42._12_4_);
      auVar58._4_4_ = auVar30._0_4_;
      auVar58._0_4_ = auVar30._0_4_;
      auVar58._8_4_ = auVar30._8_4_;
      auVar58._12_4_ = auVar30._8_4_;
      iVar72 = -(uint)(auVar42._4_4_ == iVar73);
      iVar73 = -(uint)(auVar42._12_4_ == iVar47);
      auVar45._4_4_ = iVar72;
      auVar45._0_4_ = iVar72;
      auVar45._8_4_ = iVar73;
      auVar45._12_4_ = iVar73;
      in_XMM12._4_4_ = auVar30._4_4_;
      in_XMM12._0_4_ = auVar30._4_4_;
      in_XMM12._8_4_ = auVar30._12_4_;
      in_XMM12._12_4_ = auVar30._12_4_;
      in_XMM10 = auVar45 & auVar58 | in_XMM12;
      auVar42 = packssdw(auVar30,in_XMM10);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar42 = packssdw(auVar42 ^ auVar14,auVar42 ^ auVar14);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar17[0xe].storage.data[0] = (char)lVar74 + '\x01';
      }
      auVar42 = pshufhw(auVar42,auVar58,0x84);
      auVar49 = pshufhw(auVar45,auVar45,0x84);
      auVar44 = pshufhw(auVar42,in_XMM12,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar44 | auVar49 & auVar42) ^ auVar31;
      auVar42 = packssdw(auVar31,auVar31);
      auVar42 = packsswb(auVar42,auVar42);
      if ((auVar42._14_2_ >> 8 & 1) != 0) {
        pEVar17[0xf].storage.data[0] = (char)lVar82 + '\x01';
      }
      uVar20 = uVar20 + 0x10;
      uVar21 = uVar21 + 0x10;
      lVar22 = lVar22 + 0x10;
      lVar83 = lVar83 + 0x10;
      lVar84 = lVar84 + 0x10;
      lVar40 = lVar40 + 0x10;
      lVar41 = lVar41 + 0x10;
      lVar38 = lVar38 + 0x10;
      lVar39 = lVar39 + 0x10;
      lVar36 = lVar36 + 0x10;
      lVar37 = lVar37 + 0x10;
      lVar34 = lVar34 + 0x10;
      lVar35 = lVar35 + 0x10;
      lVar32 = lVar32 + 0x10;
      lVar33 = lVar33 + 0x10;
      lVar74 = lVar74 + 0x10;
      lVar82 = lVar82 + 0x10;
      pEVar17 = pEVar17 + 0x10;
    } while ((lVar19 + 0xfU & 0xfffffffffffffff0) != uVar20);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar16;
  this->allocated = (uchar)lVar15;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }